

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O3

Frag __thiscall re2::Compiler::Quest(Compiler *this,Frag a,bool nongreedy)

{
  PatchList PVar1;
  uint uVar2;
  uint32_t uVar3;
  PatchList PVar5;
  PatchList PVar6;
  Inst *pIVar7;
  ulong uVar8;
  uint uVar9;
  uint32_t uVar10;
  Frag FVar11;
  uint32_t uStack_50;
  int iStack_4c;
  uint32_t uStack_34;
  undefined8 uVar4;
  
  uStack_34 = a.end.head;
  uVar10 = a.begin;
  if (uVar10 == 0) {
    FVar11 = Nop(this);
    uVar4 = FVar11._0_8_;
    uStack_50 = FVar11.end.tail;
    iStack_4c = CONCAT31(iStack_4c._1_3_,FVar11.nullable);
  }
  else {
    uVar2 = AllocInst(this,1);
    if ((int)uVar2 < 0) {
      uVar4 = 0;
      uStack_50 = 0;
      iStack_4c = (uint)iStack_4c._1_3_ << 8;
    }
    else {
      pIVar7 = (this->inst_).ptr_._M_t.
               super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
               super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
               super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl + uVar2;
      uVar9 = uVar2 * 2;
      if (nongreedy) {
        Prog::Inst::InitAlt(pIVar7,0,uVar10);
      }
      else {
        Prog::Inst::InitAlt(pIVar7,uVar10,0);
        uVar9 = uVar9 | 1;
      }
      PVar6 = (PatchList)((ulong)uVar9 * 0x100000001);
      PVar1 = a.end;
      uVar3 = PVar6.head;
      PVar5 = PVar1;
      uVar10 = uStack_34;
      if ((((ulong)PVar6 & 0xffffffff) != 0) && (PVar5 = PVar6, uVar10 = uVar3, uStack_34 != 0)) {
        pIVar7 = (this->inst_).ptr_._M_t.
                 super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                 _M_t.
                 super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                 super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
        uVar8 = (ulong)uVar9 / 2;
        if (((ulong)PVar6 & 0x100000000) == 0) {
          pIVar7[uVar8].out_opcode_ = pIVar7[uVar8].out_opcode_ & 0xf | uStack_34 << 4;
          PVar5 = PVar1;
        }
        else {
          pIVar7[uVar8].field_1.out1_ = uStack_34;
          PVar5 = PVar1;
        }
      }
      uStack_50 = PVar5.tail;
      iStack_4c = CONCAT31(iStack_4c._1_3_,1);
      uVar4 = CONCAT44(uVar10,uVar2);
    }
  }
  FVar11._12_4_ = iStack_4c;
  FVar11.end.tail = uStack_50;
  FVar11.begin = (int)uVar4;
  FVar11.end.head = (int)((ulong)uVar4 >> 0x20);
  return FVar11;
}

Assistant:

Frag Compiler::Quest(Frag a, bool nongreedy) {
  if (IsNoMatch(a))
    return Nop();
  int id = AllocInst(1);
  if (id < 0)
    return NoMatch();
  PatchList pl;
  if (nongreedy) {
    inst_[id].InitAlt(0, a.begin);
    pl = PatchList::Mk(id << 1);
  } else {
    inst_[id].InitAlt(a.begin, 0);
    pl = PatchList::Mk((id << 1) | 1);
  }
  return Frag(id, PatchList::Append(inst_.data(), pl, a.end), true);
}